

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Local_Trace_Test::TestBody(InterpTest_Local_Trace_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  DefinedFunc *this_00;
  char *message;
  type buf_00;
  undefined1 local_160 [8];
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  Message local_148;
  Enum local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  Result local_10c;
  undefined1 local_108 [4];
  Result result;
  MemoryStream stream;
  Ptr trap;
  Values results;
  Ptr func;
  allocator<unsigned_char> local_7a;
  uchar local_79 [65];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_Local_Trace_Test *local_10;
  InterpTest_Local_Trace_Test *this_local;
  
  local_10 = this;
  memcpy(local_79,&DAT_0030d521,0x41);
  local_38 = local_79;
  local_30 = 0x41;
  std::allocator<unsigned_char>::allocator(&local_7a);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_7a);
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator(&local_7a);
  memset(&func.root_index_,0,0x18);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&func.root_index_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::GetFuncExport
            ((Ptr *)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_InterpTest,0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)&stream.buf_);
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_108,(Stream *)0x0);
  this_00 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                      ((RefPtr<wabt::interp::DefinedFunc> *)
                       &results.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  memset(&gtest_ar.message_,0,0x18);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&gtest_ar.message_
            );
  local_10c = wabt::interp::Func::Call
                        (&this_00->super_Func,&(this->super_InterpTest).store_,
                         (Values *)&gtest_ar.message_,(Values *)&trap.root_index_,
                         (Ptr *)&stream.buf_,(Stream *)local_108);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&gtest_ar.message_
            );
  local_13c = Ok;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_138,"Result::Ok","result",&local_13c,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffeb0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0xfa,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffeb0,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
    testing::Message::~Message(&local_148);
  }
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._5_3_ = 0;
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ == 0) {
    wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_160);
    buf_00 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator*((unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *)
                       local_160);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,buf_00,
               "#0.    0: V:0  | alloca 4\n#0.    8: V:4  | i32.const 0\n#0.   16: V:5  | local.set $5, 0\n#0.   24: V:4  | i64.const 1\n#0.   36: V:5  | local.set $4, 1\n#0.   44: V:4  | f32.const 2\n#0.   52: V:5  | local.set $3, 2\n#0.   60: V:4  | f64.const 3\n#0.   72: V:5  | local.set $2, 3\n#0.   80: V:4  | drop_keep $4 $0\n#0.   92: V:0  | return\n"
              );
    std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr
              ((unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *)local_160
              );
    buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
    super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ = 0;
  }
  wabt::MemoryStream::~MemoryStream((MemoryStream *)local_108);
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)&stream.buf_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)
             &results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(InterpTest, Local_Trace) {
  // (func (export "a")
  //   (local i32 i64 f32 f64)
  //   (local.set 0 (i32.const 0))
  //   (local.set 1 (i64.const 1))
  //   (local.set 2 (f32.const 2))
  //   (local.set 3 (f64.const 3)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01,
      0x61, 0x00, 0x00, 0x0a, 0x26, 0x01, 0x24, 0x04, 0x01, 0x7f, 0x01,
      0x7e, 0x01, 0x7d, 0x01, 0x7c, 0x41, 0x00, 0x21, 0x00, 0x42, 0x01,
      0x21, 0x01, 0x43, 0x00, 0x00, 0x00, 0x40, 0x21, 0x02, 0x44, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40, 0x21, 0x03, 0x0b,
  });

  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:0  | alloca 4
#0.    8: V:4  | i32.const 0
#0.   16: V:5  | local.set $5, 0
#0.   24: V:4  | i64.const 1
#0.   36: V:5  | local.set $4, 1
#0.   44: V:4  | f32.const 2
#0.   52: V:5  | local.set $3, 2
#0.   60: V:4  | f64.const 3
#0.   72: V:5  | local.set $2, 3
#0.   80: V:4  | drop_keep $4 $0
#0.   92: V:0  | return
)");
}